

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::MultisampleTests::init(MultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *node;
  NumSamplesCase *pNVar2;
  CommonEdgeCase *pCVar3;
  MultisampleCase *pMVar4;
  char *description;
  char *name;
  int numFboSamples;
  uint uVar5;
  ulong unaff_RBP;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  FboParams local_54;
  int local_48;
  uint local_44;
  ulong local_40;
  long local_38;
  
  lVar6 = 0;
  uVar8 = 0;
  do {
    node = (TestNode *)operator_new(0x78);
    uVar5 = (uint)CONCAT71((int7)(unaff_RBP >> 8),1);
    name = "fbo_max_samples";
    numFboSamples = 0;
    description = "Render into a framebuffer object with the maximum number of samples";
    if ((uint)uVar8 < 3) {
      uVar5 = 0x10100 >> ((char)uVar8 * '\b' & 0x1fU);
      name = (char *)((long)&DAT_00b0b284 + (long)*(int *)((long)&DAT_00b0b284 + lVar6));
      numFboSamples = *(int *)((long)&DAT_00b0b290 + lVar6);
      description = (char *)((long)&DAT_00b0b29c + (long)*(int *)((long)&DAT_00b0b29c + lVar6));
    }
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_40 = uVar8;
    local_38 = lVar6;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,pCVar1->m_testCtx,name,description);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf5a60;
    node[1]._vptr_TestNode = (_func_int **)pCVar1;
    tcu::TestNode::addChild((TestNode *)this,node);
    pNVar2 = (NumSamplesCase *)operator_new(0xf8);
    local_54.useDepth = false;
    local_54.useStencil = false;
    local_54.useFbo = (bool)(char)uVar5;
    local_54.numSamples = numFboSamples;
    NumSamplesCase::NumSamplesCase
              (pNVar2,(this->super_TestCaseGroup).m_context,"num_samples_polygon",
               "Test sanity of the sample count, with polygons",&local_54);
    (pNVar2->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__NumSamplesCase_00d06b78;
    tcu::TestNode::addChild(node,(TestNode *)pNVar2);
    pNVar2 = (NumSamplesCase *)operator_new(0xf8);
    local_54.useDepth = false;
    local_54.useStencil = false;
    local_54.useFbo = (bool)(char)uVar5;
    local_54.numSamples = numFboSamples;
    local_44 = uVar5;
    NumSamplesCase::NumSamplesCase
              (pNVar2,(this->super_TestCaseGroup).m_context,"num_samples_line",
               "Test sanity of the sample count, with lines",&local_54);
    (pNVar2->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__NumSamplesCase_00d06bb8;
    tcu::TestNode::addChild(node,(TestNode *)pNVar2);
    pCVar3 = (CommonEdgeCase *)operator_new(0xe8);
    CommonEdgeCase::CommonEdgeCase
              (pCVar3,(this->super_TestCaseGroup).m_context,"common_edge_small_quads",
               "Test polygons\' common edges with small quads",CASETYPE_SMALL_QUADS,numFboSamples);
    tcu::TestNode::addChild(node,(TestNode *)pCVar3);
    pCVar3 = (CommonEdgeCase *)operator_new(0xe8);
    CommonEdgeCase::CommonEdgeCase
              (pCVar3,(this->super_TestCaseGroup).m_context,"common_edge_big_quad",
               "Test polygons\' common edges with bigger-than-viewport quads",
               CASETYPE_BIGGER_THAN_VIEWPORT_QUAD,numFboSamples);
    tcu::TestNode::addChild(node,(TestNode *)pCVar3);
    pMVar4 = (MultisampleCase *)operator_new(0xe8);
    uVar5 = local_44;
    bVar7 = (byte)local_44;
    local_54.useDepth = false;
    local_54.useStencil = false;
    local_54.useFbo = (bool)bVar7;
    local_54.numSamples = numFboSamples;
    MultisampleCase::MultisampleCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"common_edge_viewport_quad",
               "Test polygons\' common edges with exactly viewport-sized quads",0x20,&local_54);
    (pMVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleCase_00d06bf8;
    pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)0x800000002;
    *(undefined4 *)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0;
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    pNVar2 = (NumSamplesCase *)operator_new(0xf8);
    local_54.useStencil = false;
    local_54.useDepth = (bool)bVar7;
    local_54.useFbo = (bool)bVar7;
    local_54.numSamples = numFboSamples;
    NumSamplesCase::NumSamplesCase
              (pNVar2,(this->super_TestCaseGroup).m_context,"depth",
               "Test that depth values are per-sample",&local_54);
    (pNVar2->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__NumSamplesCase_00d06c30;
    tcu::TestNode::addChild(node,(TestNode *)pNVar2);
    pMVar4 = (MultisampleCase *)operator_new(0xd8);
    local_54._8_2_ = (ushort)bVar7 << 8;
    local_54.useFbo = (bool)bVar7;
    local_54.numSamples = numFboSamples;
    MultisampleCase::MultisampleCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"stencil",
               "Test that stencil values are per-sample",0x100,&local_54);
    (pMVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleCase_00d06c70;
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    pMVar4 = (MultisampleCase *)operator_new(0xd8);
    local_54.useDepth = false;
    local_54.useStencil = false;
    local_54.useFbo = (bool)bVar7;
    local_54.numSamples = numFboSamples;
    MultisampleCase::MultisampleCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"sample_coverage_invert",
               "Test that non-inverted and inverted sample coverage masks are each other\'s negations"
               ,0x100,&local_54);
    (pMVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleCase_00d06d18;
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    pMVar4 = (MultisampleCase *)operator_new(0xe8);
    local_54.useDepth = false;
    local_54.useStencil = false;
    local_54.useFbo = (bool)bVar7;
    local_54.numSamples = numFboSamples;
    MultisampleCase::MultisampleCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"proportionality_alpha_to_coverage",
               "Test the proportionality property of GL_SAMPLE_ALPHA_TO_COVERAGE",0x20,&local_54);
    (pMVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleCase_00d06ca8;
    *(undefined4 *)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
    pMVar4[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
         (TestContext *)0xffffffff00000000;
    local_48 = numFboSamples;
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    pMVar4 = (MultisampleCase *)operator_new(0xe8);
    local_54.numSamples = local_48;
    local_54.useDepth = false;
    local_54.useStencil = false;
    local_54.useFbo = (bool)bVar7;
    MultisampleCase::MultisampleCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"proportionality_sample_coverage",
               "Test the proportionality property of GL_SAMPLE_COVERAGE",0x20,&local_54);
    (pMVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleCase_00d06ca8;
    *(undefined4 *)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
    pMVar4[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
         (TestContext *)0xffffffff00000000;
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    pMVar4 = (MultisampleCase *)operator_new(0xe8);
    local_54.numSamples = local_48;
    local_54.useDepth = false;
    local_54.useStencil = false;
    local_54.useFbo = (bool)bVar7;
    MultisampleCase::MultisampleCase
              (pMVar4,(this->super_TestCaseGroup).m_context,
               "proportionality_sample_coverage_inverted",
               "Test the proportionality property of inverted-mask GL_SAMPLE_COVERAGE",0x20,
               &local_54);
    (pMVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleCase_00d06ca8;
    *(undefined4 *)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 2;
    pMVar4[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
         (TestContext *)0xffffffff00000000;
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    pMVar4 = (MultisampleCase *)operator_new(0xe0);
    local_54.numSamples = local_48;
    local_54.useDepth = false;
    local_54.useStencil = false;
    local_54.useFbo = (bool)bVar7;
    MultisampleCase::MultisampleCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_alpha_to_coverage",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE"
               ,0x100,&local_54);
    unaff_RBP = (ulong)uVar5;
    (pMVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleCase_00d06ce0;
    *(undefined2 *)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
    *(undefined1 *)
     ((long)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 2) = 0;
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    pMVar4 = (MultisampleCase *)operator_new(0xe0);
    local_54.numSamples = local_48;
    local_54.useDepth = false;
    local_54.useStencil = false;
    local_54.useFbo = (bool)bVar7;
    MultisampleCase::MultisampleCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_sample_coverage",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE"
               ,0x100,&local_54);
    (pMVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleCase_00d06ce0;
    *(undefined2 *)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x100;
    *(undefined1 *)
     ((long)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 2) = 0;
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    pMVar4 = (MultisampleCase *)operator_new(0xe0);
    local_54.numSamples = local_48;
    local_54.useDepth = false;
    local_54.useStencil = false;
    local_54.useFbo = (bool)bVar7;
    MultisampleCase::MultisampleCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_sample_coverage_inverted",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using inverted-mask GL_SAMPLE_COVERAGE"
               ,0x100,&local_54);
    (pMVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleCase_00d06ce0;
    *(undefined2 *)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x100;
    *(undefined1 *)
     ((long)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 2) = 1;
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    pMVar4 = (MultisampleCase *)operator_new(0xe0);
    local_54.numSamples = local_48;
    local_54.useDepth = false;
    local_54.useStencil = false;
    local_54.useFbo = (bool)bVar7;
    MultisampleCase::MultisampleCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_both",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_COVERAGE"
               ,0x100,&local_54);
    (pMVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleCase_00d06ce0;
    *(undefined2 *)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x101;
    *(undefined1 *)
     ((long)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 2) = 0;
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    pMVar4 = (MultisampleCase *)operator_new(0xe0);
    local_54.numSamples = local_48;
    local_54.useDepth = false;
    local_54.useStencil = false;
    local_54.useFbo = (bool)bVar7;
    MultisampleCase::MultisampleCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_both_inverted",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and inverted-mask GL_SAMPLE_COVERAGE"
               ,0x100,&local_54);
    (pMVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleCase_00d06ce0;
    *(undefined2 *)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x101;
    *(undefined1 *)
     ((long)&pMVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 2) = 1;
    tcu::TestNode::addChild(node,(TestNode *)pMVar4);
    uVar5 = (int)local_40 + 1;
    uVar8 = (ulong)uVar5;
    lVar6 = local_38 + 4;
  } while (uVar5 != 4);
  return extraout_EAX;
}

Assistant:

void MultisampleTests::init (void)
{
	enum CaseType
	{
		CASETYPE_DEFAULT_FRAMEBUFFER = 0,
		CASETYPE_FBO_4_SAMPLES,
		CASETYPE_FBO_8_SAMPLES,
		CASETYPE_FBO_MAX_SAMPLES,

		CASETYPE_LAST
	};

	for (int caseTypeI = 0; caseTypeI < (int)CASETYPE_LAST; caseTypeI++)
	{
		CaseType		caseType		= (CaseType)caseTypeI;
		int				numFboSamples	= caseType == CASETYPE_DEFAULT_FRAMEBUFFER	? -1
										: caseType == CASETYPE_FBO_4_SAMPLES		? 4
										: caseType == CASETYPE_FBO_8_SAMPLES		? 8
										: caseType == CASETYPE_FBO_MAX_SAMPLES		? 0
										: -2;

		TestCaseGroup*	group			= new TestCaseGroup(m_context,
															caseType == CASETYPE_DEFAULT_FRAMEBUFFER	? "default_framebuffer" :
															caseType == CASETYPE_FBO_4_SAMPLES			? "fbo_4_samples" :
															caseType == CASETYPE_FBO_8_SAMPLES			? "fbo_8_samples" :
															caseType == CASETYPE_FBO_MAX_SAMPLES		? "fbo_max_samples" :
															DE_NULL,
															caseType == CASETYPE_DEFAULT_FRAMEBUFFER	? "Render into default framebuffer" :
															caseType == CASETYPE_FBO_4_SAMPLES			? "Render into a framebuffer object with 4 samples" :
															caseType == CASETYPE_FBO_8_SAMPLES			? "Render into a framebuffer object with 8 samples" :
															caseType == CASETYPE_FBO_MAX_SAMPLES		? "Render into a framebuffer object with the maximum number of samples" :
															DE_NULL);
		DE_ASSERT(group->getName() != DE_NULL);
		DE_ASSERT(group->getDescription() != DE_NULL);
		DE_ASSERT(numFboSamples >= -1);
		addChild(group);

		group->addChild(new PolygonNumSamplesCase		(m_context, "num_samples_polygon",			"Test sanity of the sample count, with polygons",										numFboSamples));
		group->addChild(new LineNumSamplesCase			(m_context, "num_samples_line",				"Test sanity of the sample count, with lines",											numFboSamples));
		group->addChild(new CommonEdgeCase				(m_context, "common_edge_small_quads",		"Test polygons' common edges with small quads",											CommonEdgeCase::CASETYPE_SMALL_QUADS,				numFboSamples));
		group->addChild(new CommonEdgeCase				(m_context, "common_edge_big_quad",			"Test polygons' common edges with bigger-than-viewport quads",							CommonEdgeCase::CASETYPE_BIGGER_THAN_VIEWPORT_QUAD,	numFboSamples));
		group->addChild(new CommonEdgeCase				(m_context, "common_edge_viewport_quad",	"Test polygons' common edges with exactly viewport-sized quads",						CommonEdgeCase::CASETYPE_FIT_VIEWPORT_QUAD,			numFboSamples));
		group->addChild(new SampleDepthCase				(m_context, "depth",						"Test that depth values are per-sample",												numFboSamples));
		group->addChild(new SampleStencilCase			(m_context, "stencil",						"Test that stencil values are per-sample",												numFboSamples));
		group->addChild(new CoverageMaskInvertCase		(m_context, "sample_coverage_invert",		"Test that non-inverted and inverted sample coverage masks are each other's negations",	numFboSamples));

		group->addChild(new MaskProportionalityCase		(m_context, "proportionality_alpha_to_coverage",
																	"Test the proportionality property of GL_SAMPLE_ALPHA_TO_COVERAGE",
																	MaskProportionalityCase::CASETYPE_ALPHA_TO_COVERAGE, numFboSamples));
		group->addChild(new MaskProportionalityCase		(m_context, "proportionality_sample_coverage",
																	"Test the proportionality property of GL_SAMPLE_COVERAGE",
																	MaskProportionalityCase::CASETYPE_SAMPLE_COVERAGE, numFboSamples));
		group->addChild(new MaskProportionalityCase		(m_context, "proportionality_sample_coverage_inverted",
																	"Test the proportionality property of inverted-mask GL_SAMPLE_COVERAGE",
																	MaskProportionalityCase::CASETYPE_SAMPLE_COVERAGE_INVERTED, numFboSamples));

		group->addChild(new MaskConstancyCase			(m_context, "constancy_alpha_to_coverage",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE",
																	MaskConstancyCase::CASETYPE_ALPHA_TO_COVERAGE, numFboSamples));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_sample_coverage",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE",
																	MaskConstancyCase::CASETYPE_SAMPLE_COVERAGE, numFboSamples));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_sample_coverage_inverted",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using inverted-mask GL_SAMPLE_COVERAGE",
																	MaskConstancyCase::CASETYPE_SAMPLE_COVERAGE_INVERTED, numFboSamples));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_both",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_COVERAGE",
																	MaskConstancyCase::CASETYPE_BOTH, numFboSamples));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_both_inverted",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and inverted-mask GL_SAMPLE_COVERAGE",
																	MaskConstancyCase::CASETYPE_BOTH_INVERTED, numFboSamples));
	}
}